

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O0

int linux_eventfd_lower(eventfd *efd)

{
  ssize_t sVar1;
  int *piVar2;
  int *in_RDI;
  int rv;
  ssize_t n;
  uint64_t cur;
  int local_1c;
  undefined1 local_10 [16];
  
  local_1c = 0;
  sVar1 = read(*in_RDI,local_10,8);
  if (sVar1 < 0) {
    piVar2 = __errno_location();
    if (*piVar2 == 4) {
      local_1c = -4;
    }
    else if (*piVar2 != 0xb) {
      local_1c = -1;
    }
  }
  else if (sVar1 != 8) {
    local_1c = -1;
  }
  return local_1c;
}

Assistant:

static int
linux_eventfd_lower(struct eventfd *efd)
{
    uint64_t cur;
    ssize_t n;
    int rv = 0;

    /*
     * Reset the counter
     * Because we're not using EFD_SEMPAHOR the level
     * state of the eventfd is cleared.
     *
     * Thus if there were multiple calls to
     * linux_eventfd_raise, and a single call to
     * linux_eventfd_lower, the eventfd state would
     * still be lowered.
     */
    dbg_printf("eventfd=%i - lowering event level", efd->ef_id);
    n = read(efd->ef_id, &cur, sizeof(cur));
    if (n < 0) {
        switch (errno) {
        case EAGAIN:
            /* Not considered an error */
            break;

        case EINTR:
            rv = -EINTR;
            break;

        default:
            dbg_printf("read(2): %s", strerror(errno));
            rv = -1;
        }
    } else if (n != sizeof(cur)) {
        dbg_puts("short read");
        rv = -1;
    }

    return (rv);
}